

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsRelease(JsRef ref,uint *count)

{
  anon_class_24_3_67fec310 fn;
  anon_class_16_2_d8842485 fn_00;
  bool bVar1;
  ThreadContext *this;
  uint **in_stack_ffffffffffffffa0;
  Recycler *recycler;
  ThreadContext *threadContext;
  uint *local_20;
  uint *count_local;
  JsRef ref_local;
  
  if (ref == (JsRef)0x0) {
    ref_local._4_4_ = JsErrorInvalidArgument;
  }
  else {
    if (count != (uint *)0x0) {
      *count = 0;
    }
    local_20 = count;
    count_local = (uint *)ref;
    bVar1 = Js::TaggedNumber::Is(ref);
    if (bVar1) {
      if (local_20 != (uint *)0x0) {
        *local_20 = 1;
      }
      ref_local._4_4_ = JsNoError;
    }
    else {
      bVar1 = JsrtContext::Is(count_local);
      if (bVar1) {
        fn_00.count = &local_20;
        fn_00.ref = &count_local;
        ref_local._4_4_ = GlobalAPIWrapper_NoRecord<JsRelease::__0>(fn_00);
      }
      else {
        this = ThreadContext::GetContextForCurrentThread();
        if (this == (ThreadContext *)0x0) {
          ref_local._4_4_ = JsErrorNoCurrentContext;
        }
        else {
          ThreadContext::GetRecycler(this);
          fn.ref = &local_20;
          fn.recycler = (Recycler **)&count_local;
          fn.count = in_stack_ffffffffffffffa0;
          ref_local._4_4_ = GlobalAPIWrapper<JsRelease::__1>(fn);
        }
      }
    }
  }
  return ref_local._4_4_;
}

Assistant:

CHAKRA_API JsRelease(_In_ JsRef ref, _Out_opt_ unsigned int *count)
{
    VALIDATE_JSREF(ref);
    if (count != nullptr)
    {
        *count = 0;
    }

    if (Js::TaggedNumber::Is(ref))
    {
        // The count is always one because these are never collected
        if (count)
        {
            *count = 1;
        }
        return JsNoError;
    }

    if (JsrtContext::Is(ref))
    {
        return GlobalAPIWrapper_NoRecord([&] () -> JsErrorCode
        {
            Recycler * recycler = static_cast<JsrtContext *>(ref)->GetRuntime()->GetThreadContext()->GetRecycler();
            recycler->RootRelease(ref, count);
            return JsNoError;
        });
    }
    else
    {
        ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();
        if (threadContext == nullptr)
        {
            return JsErrorNoCurrentContext;
        }
        Recycler * recycler = threadContext->GetRecycler();
        return GlobalAPIWrapper([&](TTDRecorder& _actionEntryPopper) -> JsErrorCode
        {
            // Note, some references may live in arena-allocated memory, so we need to do this check
            if (!recycler->IsValidObject(ref))
            {
                return JsNoError;
            }

            recycler->RootRelease(ref, count);

            return JsNoError;
        });
    }
}